

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode MonitoredItem_registerSampleJob(UA_Server *server,UA_MonitoredItem *mon)

{
  UA_Job job_00;
  UA_StatusCode UVar1;
  undefined4 uStack_2c;
  UA_Job job;
  
  job_00._4_4_ = uStack_2c;
  job_00.type = 4;
  job_00.job.closeConnection = (UA_Connection *)mon;
  job_00.job.methodCall.method = UA_MoniteredItem_SampleCallback;
  job_00.job._16_8_ = job.job._8_8_;
  UVar1 = UA_Server_addRepeatedJob
                    (server,job_00,(UA_UInt32)(long)mon->samplingInterval,&mon->sampleJobGuid);
  if (UVar1 == 0) {
    mon->sampleJobIsRegistered = true;
  }
  return UVar1;
}

Assistant:

UA_StatusCode
MonitoredItem_registerSampleJob(UA_Server *server, UA_MonitoredItem *mon) {
    UA_Job job;
    job.type = UA_JOBTYPE_METHODCALL;
    job.job.methodCall.method = (UA_ServerCallback)UA_MoniteredItem_SampleCallback;
    job.job.methodCall.data = mon;
    UA_StatusCode retval = UA_Server_addRepeatedJob(server, job,
                                                    (UA_UInt32)mon->samplingInterval,
                                                    &mon->sampleJobGuid);
    if(retval == UA_STATUSCODE_GOOD)
        mon->sampleJobIsRegistered = true;
    return retval;
}